

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

void __thiscall
TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test::testBody
          (TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_88 [16];
  StringEqualNoCaseFailure f;
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_88,"text");
  StringEqualNoCaseFailure::StringEqualNoCaseFailure
            (&f,pUVar1,"fail.cpp",2,"ABC","abd",(SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "Message: text\n\texpected <ABC>\n\tbut was  <abd>\n\tdifference starts at position 2 at: <        abd         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x104,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  TestFailure::~TestFailure(&f.super_TestFailure);
  return;
}

Assistant:

TEST(TestFailure, StringsEqualNoCaseFailureWithText)
{
    StringEqualNoCaseFailure f(test, failFileName, failLineNumber, "ABC", "abd", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <ABC>\n"
                  "\tbut was  <abd>\n"
                  "\tdifference starts at position 2 at: <        abd         >\n"
                  "\t                                               ^", f);
}